

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

MultisamplePixelBufferAccess * __thiscall
sglr::ReferenceContext::getReadColorbuffer
          (MultisamplePixelBufferAccess *__return_storage_ptr__,ReferenceContext *this)

{
  PixelBufferAccess PStack_38;
  
  if (this->m_readFramebufferBinding == (Framebuffer *)0x0) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)__return_storage_ptr__,
               (ConstPixelBufferAccess *)&this->m_defaultColorbuffer);
  }
  else {
    getFboAttachment(&PStack_38,this,this->m_readFramebufferBinding,ATTACHMENTPOINT_COLOR0);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(__return_storage_ptr__,&PStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

rr::MultisamplePixelBufferAccess	getReadColorbuffer		(void)	{ return (m_readFramebufferBinding) ? (rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(getFboAttachment(*m_readFramebufferBinding, rc::Framebuffer::ATTACHMENTPOINT_COLOR0)))	:	(m_defaultColorbuffer);		}